

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void __thiscall
capnp::compiler::Compiler::Node::traverse
          (Node *this,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  _Base_ptr __src;
  size_t sVar1;
  Reader *pRVar2;
  Reader *pRVar3;
  RemoveConst<capnp::schema::Node::SourceInfo::Reader> *__dest;
  Node *this_00;
  undefined8 *puVar4;
  undefined8 uVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  _Rb_tree_node_base *p_Var8;
  Reader *aux;
  Reader *schemaNode;
  ulong newSize;
  uint eagerness_00;
  Node **child;
  undefined8 *puVar9;
  long lVar10;
  _Rb_tree_node_base *p_Var11;
  Content *content;
  NullableValue<capnp::schema::Node::Reader> _schema683;
  undefined1 local_110 [16];
  Maybe<capnp::compiler::Compiler::Node_&> MStack_100;
  SegmentReader *local_f8;
  WirePointer *pWStack_f0;
  void *local_e8;
  WirePointer *pWStack_e0;
  Maybe<capnp::schema::Node::Reader> local_d8;
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  local_a0;
  
  local_110._0_8_ = this;
  pmVar6 = std::__detail::
           _Map_base<capnp::compiler::Compiler::Node_*,_std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::hash<capnp::compiler::Compiler::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<capnp::compiler::Compiler::Node_*,_std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::hash<capnp::compiler::Compiler::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)seen,(key_type *)local_110);
  if ((eagerness & ~*pmVar6) != 0) {
    *pmVar6 = *pmVar6 | eagerness;
    getContent((Node *)local_110,(State)this);
    uVar5 = local_110._0_8_;
    if ((Node *)local_110._0_8_ != (Node *)0x0) {
      loadFinalSchema(this,finalLoader);
      getFinalSchema(&local_d8,this);
      local_110[0] = local_d8.ptr.isSet;
      if (local_d8.ptr.isSet == true) {
        local_e8 = (void *)local_d8.ptr.field_1._32_8_;
        pWStack_e0 = (WirePointer *)local_d8.ptr.field_1._40_8_;
        local_f8 = (SegmentReader *)local_d8.ptr.field_1.value._reader.data;
        pWStack_f0 = local_d8.ptr.field_1.value._reader.pointers;
        local_110._8_8_ = local_d8.ptr.field_1.value._reader.segment;
        MStack_100.ptr = (Node *)local_d8.ptr.field_1.value._reader.capTable;
      }
      if (0x7fff < eagerness && local_d8.ptr.isSet == true) {
        eagerness_00 = eagerness & 0xffff8000 | eagerness >> 0xf;
        traverseNodeDependencies
                  (this,(Reader *)(local_110 + 8),eagerness_00,seen,finalLoader,sourceInfo);
        if (*(_Base_ptr *)(uVar5 + 0xe0) != (_Base_ptr)0x0) {
          schemaNode = *(Reader **)&((_Rb_tree_header *)(uVar5 + 0xd8))->_M_header;
          lVar10 = (long)*(_Base_ptr *)(uVar5 + 0xe0) * 0x30;
          do {
            traverseNodeDependencies(this,schemaNode,eagerness_00,seen,finalLoader,sourceInfo);
            schemaNode = schemaNode + 1;
            lVar10 = lVar10 + -0x30;
          } while (lVar10 != 0);
        }
      }
      __src = *(_Base_ptr *)(uVar5 + 0xf0);
      sVar1 = *(size_t *)(uVar5 + 0xf8);
      pRVar2 = (sourceInfo->builder).ptr;
      uVar7 = ((long)(sourceInfo->builder).pos - (long)pRVar2 >> 4) * -0x5555555555555555 + sVar1;
      pRVar3 = (sourceInfo->builder).endPtr;
      lVar10 = (long)pRVar3 - (long)pRVar2 >> 4;
      if ((ulong)(lVar10 * -0x5555555555555555) < uVar7) {
        newSize = 4;
        if (pRVar3 != pRVar2) {
          newSize = lVar10 * 0x5555555555555556;
        }
        if (newSize < uVar7) {
          newSize = uVar7;
        }
        kj::Vector<capnp::schema::Node::SourceInfo::Reader>::setCapacity(sourceInfo,newSize);
      }
      __dest = (sourceInfo->builder).pos;
      if (sVar1 != 0) {
        memcpy(__dest,__src,sVar1 * 0x30);
      }
      (sourceInfo->builder).pos = __dest + sVar1;
    }
    if (((eagerness & 2) != 0) && (this_00 = (this->parent).ptr, this_00 != (Node *)0x0)) {
      traverse(this_00,eagerness,seen,finalLoader,sourceInfo);
    }
    if (((eagerness & 4) != 0) &&
       (getContent((Node *)local_110,(State)this), uVar5 = local_110._0_8_,
       (Node *)local_110._0_8_ != (Node *)0x0)) {
      puVar4 = *(undefined8 **)(local_110._0_8_ + 0x40);
      for (puVar9 = *(undefined8 **)(local_110._0_8_ + 0x38); puVar9 != puVar4; puVar9 = puVar9 + 1)
      {
        traverse((Node *)*puVar9,eagerness,seen,finalLoader,sourceInfo);
      }
      p_Var8 = *(_Rb_tree_node_base **)(uVar5 + 0x70);
      p_Var11 = (_Rb_tree_node_base *)(uVar5 + 0x60);
      if (p_Var8 != p_Var11) {
        do {
          Alias::compile(&local_a0,(Alias *)p_Var8[1]._M_right);
          if (local_a0.ptr.isSet == true) {
            if (local_a0.ptr.field_1.value.tag == EXPANDED) {
              local_a0.ptr.field_1.value.tag = STUB;
            }
            if (local_a0.ptr.field_1.value.tag == BOOTSTRAP) {
              local_a0.ptr.field_1.value.tag = STUB;
            }
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while (p_Var8 != p_Var11);
      }
    }
  }
  return;
}

Assistant:

void Compiler::Node::traverse(uint eagerness, std::unordered_map<Node*, uint>& seen,
                              const SchemaLoader& finalLoader,
                              kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  uint& slot = seen[this];
  if ((slot & eagerness) == eagerness) {
    // We've already covered this node.
    return;
  }
  slot |= eagerness;

  KJ_IF_SOME(content, getContent(Content::FINISHED)) {
    loadFinalSchema(finalLoader);

    KJ_IF_SOME(schema, getFinalSchema()) {
      if (eagerness / DEPENDENCIES != 0) {
        // For traversing dependencies, discard the bits lower than DEPENDENCIES and replace
        // them with the bits above DEPENDENCIES shifted over.
        uint newEagerness = (eagerness & ~(DEPENDENCIES - 1)) | (eagerness / DEPENDENCIES);

        traverseNodeDependencies(schema, newEagerness, seen, finalLoader, sourceInfo);
        for (auto& aux: content.auxSchemas) {
          traverseNodeDependencies(aux, newEagerness, seen, finalLoader, sourceInfo);
        }
      }
    }

    sourceInfo.addAll(content.sourceInfo);
  }

  if (eagerness & PARENTS) {
    KJ_IF_SOME(p, parent) {
      p.traverse(eagerness, seen, finalLoader, sourceInfo);
    }
  }

  if (eagerness & CHILDREN) {
    KJ_IF_SOME(content, getContent(Content::EXPANDED)) {
      for (auto& child: content.orderedNestedNodes) {
        child->traverse(eagerness, seen, finalLoader, sourceInfo);
      }

      // Also traverse `using` declarations.
      for (auto& child: content.aliases) {
        child.second->compile();
      }
    }
  }
}